

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O1

optional_ptr<duckdb::Binding,_true> __thiscall
duckdb::Binder::GetMatchingBinding
          (Binder *this,string *catalog_name,string *schema_name,string *table_name,
          string *column_name,ErrorData *error)

{
  optional_ptr<duckdb::DummyBinding,_true> *this_00;
  DummyBinding *pDVar1;
  pointer pcVar2;
  size_t __n;
  int iVar3;
  string *psVar4;
  optional_ptr<duckdb::Binding,_true> oVar5;
  bool bVar6;
  BindingAlias alias;
  string local_110;
  string local_f0;
  string local_d0;
  undefined1 *local_b0;
  size_t local_a8;
  undefined1 local_a0 [16];
  BindingAlias local_90;
  
  this_00 = &this->macro_binding;
  pDVar1 = (this->macro_binding).ptr;
  if (pDVar1 != (DummyBinding *)0x0) {
    optional_ptr<duckdb::DummyBinding,_true>::CheckValid(this_00);
    psVar4 = BindingAlias::GetAlias_abi_cxx11_(&(this_00->ptr->super_Binding).alias);
    local_b0 = local_a0;
    pcVar2 = (psVar4->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + psVar4->_M_string_length);
    __n = table_name->_M_string_length;
    if (__n == local_a8) {
      if (__n == 0) {
        bVar6 = true;
      }
      else {
        iVar3 = bcmp((table_name->_M_dataplus)._M_p,local_b0,__n);
        bVar6 = iVar3 == 0;
      }
      goto LAB_0074a37b;
    }
  }
  bVar6 = false;
LAB_0074a37b:
  if ((pDVar1 != (DummyBinding *)0x0) && (local_b0 != local_a0)) {
    operator_delete(local_b0);
  }
  if (bVar6) {
    oVar5.ptr = &this_00->ptr->super_Binding;
  }
  else {
    pcVar2 = (catalog_name->_M_dataplus)._M_p;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar2,pcVar2 + catalog_name->_M_string_length);
    pcVar2 = (schema_name->_M_dataplus)._M_p;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar2,pcVar2 + schema_name->_M_string_length);
    pcVar2 = (table_name->_M_dataplus)._M_p;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar2,pcVar2 + table_name->_M_string_length);
    BindingAlias::BindingAlias(&local_90,&local_d0,&local_f0,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    oVar5 = BindContext::GetBinding(&this->bind_context,&local_90,column_name,error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.alias._M_dataplus._M_p != &local_90.alias.field_2) {
      operator_delete(local_90.alias._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.schema._M_dataplus._M_p != &local_90.schema.field_2) {
      operator_delete(local_90.schema._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.catalog._M_dataplus._M_p != &local_90.catalog.field_2) {
      operator_delete(local_90.catalog._M_dataplus._M_p);
    }
  }
  return (optional_ptr<duckdb::Binding,_true>)oVar5.ptr;
}

Assistant:

optional_ptr<Binding> Binder::GetMatchingBinding(const string &catalog_name, const string &schema_name,
                                                 const string &table_name, const string &column_name,
                                                 ErrorData &error) {
	optional_ptr<Binding> binding;
	D_ASSERT(!lambda_bindings);
	if (macro_binding && table_name == macro_binding->GetAlias()) {
		binding = optional_ptr<Binding>(macro_binding.get());
	} else {
		BindingAlias alias(catalog_name, schema_name, table_name);
		binding = bind_context.GetBinding(alias, column_name, error);
	}
	return binding;
}